

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O1

bool __thiscall cmFindProgramHelper::FileIsValid(cmFindProgramHelper *this,string *file)

{
  bool bVar1;
  
  bVar1 = FileIsExecutableCMP0109(this,file);
  if (bVar1) {
    bVar1 = cmFindBase::Validate(this->FindBase,file);
    return bVar1;
  }
  return false;
}

Assistant:

bool FileIsValid(std::string const& file) const
  {
    if (!this->FileIsExecutableCMP0109(file)) {
      return false;
    }
#ifdef _WIN32
    // Pretend the Windows "python" app installer alias does not exist.
    if (cmSystemTools::LowerCase(file).find("/windowsapps/python") !=
        std::string::npos) {
      std::string dest;
      if (cmSystemTools::ReadSymlink(file, dest) &&
          cmHasLiteralSuffix(dest, "\\AppInstallerPythonRedirector.exe")) {
        return false;
      }
    }
#endif
    return this->FindBase->Validate(file);
  }